

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O0

void __thiscall icu_63::UVector32::removeElementAt(UVector32 *this,int32_t index)

{
  int local_18;
  int32_t i;
  int32_t index_local;
  UVector32 *this_local;
  
  local_18 = index;
  if (-1 < index) {
    for (; local_18 < this->count + -1; local_18 = local_18 + 1) {
      this->elements[local_18] = this->elements[local_18 + 1];
    }
    this->count = this->count + -1;
  }
  return;
}

Assistant:

void UVector32::removeElementAt(int32_t index) {
    if (index >= 0) {
        for (int32_t i=index; i<count-1; ++i) {
            elements[i] = elements[i+1];
        }
        --count;
    }
}